

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O1

void lj_opt_sink(jit_State *J)

{
  char *pcVar1;
  byte *pbVar2;
  IROp1 IVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  SnapShot *pSVar8;
  SnapEntry *pSVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  IRIns *pIVar14;
  IRRef1 *pIVar15;
  IRIns *pIVar16;
  ulong uVar17;
  long lVar18;
  IRRef ref;
  IRIns *pIVar19;
  IRIns *pIVar20;
  
  if (((~J->flags & 0x10f0000) != 0) ||
     ((((J->chain[0x51] == 0 && (J->chain[0x52] == 0)) && (J->chain[0x53] == 0)) &&
      (J->chain[0x54] == 0)))) {
    return;
  }
  if (J->loopref == 0) {
    pSVar8 = (J->cur).snap;
    uVar17 = (ulong)(J->cur).nsnap;
    uVar13 = (ulong)pSVar8[uVar17 - 1].nent;
    if (uVar13 != 0) {
      uVar12 = pSVar8[uVar17 - 1].mapofs;
      pSVar9 = (J->cur).snapmap;
      uVar17 = 0;
      do {
        uVar7 = (ushort)pSVar9[uVar12 + uVar17];
        if (0x7fff < uVar7) {
          pbVar2 = (byte *)((long)(J->cur).ir + (ulong)uVar7 * 8 + 4);
          *pbVar2 = *pbVar2 | 0x20;
        }
        uVar17 = uVar17 + 1;
      } while (uVar13 != uVar17);
    }
  }
  pIVar20 = (J->cur).ir + ((J->cur).nins - 1);
LAB_0014d45c:
  IVar3 = (pIVar20->field_1).o;
  switch(IVar3) {
  case 'B':
  case 'C':
  case 'F':
  case 'I':
  case 'X':
  case 'b':
  case 'c':
    goto switchD_0014d471_caseD_42;
  case 'D':
  case 'G':
  case 'H':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'U':
  case 'V':
  case 'W':
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'a':
switchD_0014d471_caseD_44:
    if (((pIVar20->field_1).t.irt & 0xa0) != 0) {
      if (0x8000 < (ulong)(pIVar20->field_0).op1) {
        pbVar2 = (byte *)((long)(J->cur).ir + (ulong)(pIVar20->field_0).op1 * 8 + 4);
        *pbVar2 = *pbVar2 | 0x20;
      }
      uVar12 = (uint)(pIVar20->field_0).op2;
      if ((pIVar20->field_0).op2 < 0x8001) goto LAB_0014d565;
      goto LAB_0014d55a;
    }
    goto LAB_0014d565;
  case 'E':
    if ((((pIVar20->field_1).t.irt & 0x20) == 0) && ((pIVar20->field_0).op2 != 5))
    goto LAB_0014d565;
    goto switchD_0014d471_caseD_42;
  case 'J':
  case 'K':
  case 'M':
  case 'N':
    pIVar16 = (J->cur).ir;
    if (*(short *)((long)pIVar16 + (ulong)(pIVar20->field_0).op1 * 8 + 2) < 0) {
LAB_0014d4c1:
      pIVar19 = (IRIns *)0x0;
    }
    else {
      pIVar14 = pIVar16 + (pIVar20->field_0).op1;
      uVar17 = (ulong)(pIVar14->field_1).o;
      if (0x3e < uVar17) goto LAB_0014d4c1;
      if ((0x4c00020000000000U >> (uVar17 & 0x3f) & 1) == 0) {
        pIVar19 = (IRIns *)0x0;
        if ((0x300000000000000U >> (uVar17 & 0x3f) & 1) != 0) {
          pIVar14 = pIVar16 + (pIVar14->field_0).op1;
          goto LAB_0014d4b2;
        }
      }
      else {
LAB_0014d4b2:
        if (2 < (byte)(*(char *)((long)pIVar16 + (ulong)(pIVar14->field_0).op1 * 8 + 5) + 0xafU))
        goto LAB_0014d4c1;
        pIVar19 = pIVar16 + (pIVar14->field_0).op1;
      }
    }
    if ((pIVar19 == (IRIns *)0x0) ||
       ((((pIVar19->field_1).t.irt & 0x40) != 0 &&
        (iVar11 = sink_checkphi(J,pIVar19,(uint)(pIVar20->field_0).op2), iVar11 == 0)))) {
      pbVar2 = (byte *)((long)(J->cur).ir + (ulong)(pIVar20->field_0).op1 * 8 + 4);
      *pbVar2 = *pbVar2 | 0x20;
    }
    break;
  case 'L':
    break;
  case 'T':
    if ((((pIVar20->field_1).t.irt & 0x40) != 0) &&
       (iVar11 = sink_checkphi(J,pIVar20,(uint)(pIVar20->field_0).op2), iVar11 == 0)) {
      (pIVar20->field_1).t.irt = (pIVar20->field_1).t.irt | 0x20;
    }
    break;
  default:
    if (IVar3 == '\x13') {
      pIVar16 = (J->cur).ir;
      uVar13 = (ulong)(pIVar20->field_0).op1;
      uVar17 = (ulong)(pIVar20->field_0).op2;
      *(undefined2 *)((long)pIVar16 + uVar17 * 8 + 6) = 0;
      *(undefined2 *)((long)pIVar16 + uVar13 * 8 + 6) = 0;
      cVar4 = *(char *)((long)pIVar16 + uVar13 * 8 + 5);
      if (cVar4 == *(char *)((long)pIVar16 + uVar17 * 8 + 5) && (byte)(cVar4 + 0xafU) < 4)
      goto LAB_0014d565;
      pIVar14 = pIVar16 + uVar17;
      pbVar2 = (byte *)((long)pIVar16 + uVar13 * 8 + 4);
      *pbVar2 = *pbVar2 | 0x20;
      goto LAB_0014d561;
    }
    if (IVar3 != '\r') goto switchD_0014d471_caseD_44;
    uVar12 = J->loopref;
    while (uVar12 != 0) {
      pIVar20 = (J->cur).ir;
      uVar17 = (ulong)((J->cur).nins - 1);
      if (*(char *)((long)pIVar20 + uVar17 * 8 + 5) != '\x13') break;
      pIVar15 = &(&pIVar20->field_0)[uVar17].op2;
      uVar12 = 0;
      do {
        pIVar20 = (J->cur).ir;
        uVar17 = (ulong)((anon_struct_8_4_c535eab0_for_IRIns_0 *)(pIVar15 + -1))->op1;
        bVar5 = *(byte *)((long)pIVar20 + uVar17 * 8 + 4);
        bVar6 = *(byte *)((long)pIVar20 + (ulong)*pIVar15 * 8 + 4);
        if ((((bVar6 ^ bVar5) & 0x20) != 0) ||
           (*(short *)((long)pIVar20 + uVar17 * 8 + 6) !=
            *(short *)((long)pIVar20 + (ulong)*pIVar15 * 8 + 6))) {
          uVar12 = uVar12 | ~(bVar6 & bVar5) & 0x20;
          *(byte *)((long)pIVar20 + uVar17 * 8 + 4) = bVar5 | 0x20;
          pbVar2 = (byte *)((long)(J->cur).ir + (ulong)*pIVar15 * 8 + 4);
          *pbVar2 = *pbVar2 | 0x20;
        }
        pcVar1 = (char *)((long)pIVar15 + -5);
        pIVar15 = pIVar15 + -4;
      } while (*pcVar1 == '\x13');
    }
    pIVar20 = (J->cur).ir;
    uVar12 = (J->cur).nins - 1;
    if (0x7fff < uVar12) {
      lVar18 = (ulong)uVar12 << 3;
      do {
        bVar5 = *(byte *)((long)pIVar20 + lVar18 + 5);
        uVar12 = bVar5 - 0x3b;
        if (uVar12 < 0x1a) {
          if ((0xd8000U >> (uVar12 & 0x1f) & 1) == 0) {
            if ((0x3c00000U >> (uVar12 & 0x1f) & 1) != 0) {
              bVar5 = *(byte *)((long)pIVar20 + lVar18 + 4);
              if ((bVar5 & 0x20) != 0) {
                *(byte *)((long)pIVar20 + lVar18 + 4) = bVar5 & 0xdf;
                goto LAB_0014d7b8;
              }
              *(byte *)((long)pIVar20 + lVar18 + 4) = bVar5 & 0x5f;
              *(undefined2 *)((long)pIVar20 + lVar18 + 6) = 0xfe;
              (J->cur).sinktags = '\x01';
              goto LAB_0014d7bf;
            }
            if (uVar12 != 0) goto LAB_0014d742;
            if ((*(byte *)((long)(J->cur).ir + (ulong)*(ushort *)((long)pIVar20 + lVar18) * 8 + 4) &
                0x20) == 0) goto LAB_0014d769;
            goto LAB_0014d772;
          }
          pIVar16 = (J->cur).ir;
          if (*(short *)((long)pIVar16 + (ulong)*(ushort *)((long)pIVar20 + lVar18) * 8 + 2) < 0) {
LAB_0014d717:
            pIVar19 = (IRIns *)0x0;
          }
          else {
            pIVar14 = pIVar16 + *(ushort *)((long)pIVar20 + lVar18);
            uVar17 = (ulong)(pIVar14->field_1).o;
            if (0x3e < uVar17) goto LAB_0014d717;
            if ((0x4c00020000000000U >> (uVar17 & 0x3f) & 1) == 0) {
              pIVar19 = (IRIns *)0x0;
              if ((0x300000000000000U >> (uVar17 & 0x3f) & 1) != 0) {
                pIVar14 = pIVar16 + (pIVar14->field_0).op1;
                goto LAB_0014d704;
              }
            }
            else {
LAB_0014d704:
              if (2 < (byte)(*(char *)((long)pIVar16 + (ulong)(pIVar14->field_0).op1 * 8 + 5) +
                            0xafU)) goto LAB_0014d717;
              pIVar19 = pIVar16 + (pIVar14->field_0).op1;
            }
          }
          if ((pIVar19 == (IRIns *)0x0) || (((pIVar19->field_1).t.irt & 0x20) != 0))
          goto LAB_0014d7b8;
          iVar11 = (int)((ulong)((long)pIVar20 + (lVar18 - (long)pIVar19)) >> 3);
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          *(ushort *)((long)pIVar20 + lVar18 + 6) = (ushort)(iVar11 << 8) | 0xfe;
        }
        else {
LAB_0014d742:
          if (bVar5 == 0x13) {
            pIVar16 = (J->cur).ir;
            uVar17 = (ulong)*(ushort *)((long)pIVar20 + lVar18 + 2);
            if (((*(byte *)((long)pIVar16 + uVar17 * 8 + 4) & 0x20) == 0) &&
               ((byte)(*(char *)((long)pIVar16 + uVar17 * 8 + 5) + 0xafU) < 4)) {
LAB_0014d769:
              *(undefined2 *)((long)pIVar20 + lVar18 + 6) = 0xfe;
              goto LAB_0014d7bf;
            }
          }
          else {
LAB_0014d772:
            pbVar2 = (byte *)((long)pIVar20 + lVar18 + 4);
            *pbVar2 = *pbVar2 & 0xdf;
          }
LAB_0014d7b8:
          *(undefined2 *)((long)pIVar20 + lVar18 + 6) = 0xff;
        }
LAB_0014d7bf:
        bVar10 = 0x40007 < lVar18;
        lVar18 = lVar18 + -8;
      } while (bVar10);
    }
    for (pIVar16 = (J->cur).ir + (J->cur).nk; pIVar16 < pIVar20 + 0x8000; pIVar16 = pIVar16 + 1) {
      uVar12._0_2_ = *(IROpT *)((long)pIVar16 + 4);
      uVar12._2_2_ = *(IRRef1 *)((long)pIVar16 + 6);
      (pIVar16->field_1).t.irt = (byte)(undefined2)uVar12 & 0xdf;
      (pIVar16->field_0).prev = 0xff;
      if ((0x605fd9U >> (uVar12 & 0x1f) & 1) != 0) {
        pIVar16 = pIVar16 + ((pIVar16->field_1).o != '\x1b');
      }
    }
    return;
  }
  uVar12 = (uint)(pIVar20->field_0).op2;
LAB_0014d55a:
  pIVar14 = (IRIns *)((ulong)(uVar12 << 3) + (long)(J->cur).ir);
LAB_0014d561:
  (pIVar14->field_1).t.irt = (pIVar14->field_1).t.irt | 0x20;
LAB_0014d565:
  pIVar20 = pIVar20 + -1;
  goto LAB_0014d45c;
switchD_0014d471_caseD_42:
  uVar12 = (uint)(pIVar20->field_0).op1;
  goto LAB_0014d55a;
}

Assistant:

void lj_opt_sink(jit_State *J)
{
  const uint32_t need = (JIT_F_OPT_SINK|JIT_F_OPT_FWD|
			 JIT_F_OPT_DCE|JIT_F_OPT_CSE|JIT_F_OPT_FOLD);
  if ((J->flags & need) == need &&
      (J->chain[IR_TNEW] || J->chain[IR_TDUP] ||
       (LJ_HASFFI && (J->chain[IR_CNEW] || J->chain[IR_CNEWI])))) {
    if (!J->loopref)
      sink_mark_snap(J, &J->cur.snap[J->cur.nsnap-1]);
    sink_mark_ins(J);
    if (J->loopref)
      sink_remark_phi(J);
    sink_sweep_ins(J);
  }
}